

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *arena;
  FeatureVectorizer_InputColumn *pFVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (already_allocated < length) {
    arena = this->arena_;
    for (lVar4 = (long)already_allocated; lVar4 < length; lVar4 = lVar4 + 1) {
      pFVar1 = Arena::CreateMaybeMessage<CoreML::Specification::FeatureVectorizer_InputColumn>
                         (arena);
      our_elems[lVar4] = pFVar1;
    }
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)length;
  if (length < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    GenericTypeHandler<CoreML::Specification::FeatureVectorizer_InputColumn>::Merge
              ((FeatureVectorizer_InputColumn *)other_elems[uVar3],
               (FeatureVectorizer_InputColumn *)our_elems[uVar3]);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  if (already_allocated < length) {
    Arena* arena = GetArena();
    typename TypeHandler::Type* elem_prototype =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[0]);
    for (int i = already_allocated; i < length; i++) {
      // Allocate a new empty element that we'll merge into below
      typename TypeHandler::Type* new_elem =
          TypeHandler::NewFromPrototype(elem_prototype, arena);
      our_elems[i] = new_elem;
    }
  }
  // Main loop that does the actual merging
  for (int i = 0; i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
}